

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  ImGuiContextHook *pIVar10;
  ImGuiViewportP *pIVar11;
  ImGuiWindow *window;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  ImU32 IVar20;
  ImDrawList *pIVar21;
  ImGuiWindow *pIVar22;
  char cVar23;
  ImDrawList **ppIVar24;
  ImGuiContext *g;
  ulong uVar25;
  int n;
  long lVar26;
  ImGuiWindow *pIVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  ImVec2 cr_max;
  float fVar31;
  ImGuiWindow *windows_to_render_top_most [2];
  ImVec2 local_58;
  ImVec2 IStack_50;
  undefined1 local_48 [12];
  float fStack_3c;
  
  pIVar18 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  iVar8 = pIVar18->FrameCount;
  iVar9 = pIVar18->FrameCountRendered;
  pIVar18->FrameCountRendered = iVar8;
  (pIVar18->IO).MetricsRenderWindows = 0;
  if (0 < (pIVar18->Hooks).Size) {
    lVar26 = 0;
    lVar28 = 0;
    do {
      pIVar10 = (pIVar18->Hooks).Data;
      if (*(int *)(pIVar10 + lVar26 + 4) == 4) {
        (**(code **)(pIVar10 + lVar26 + 0x10))(pIVar18);
      }
      lVar28 = lVar28 + 1;
      lVar26 = lVar26 + 0x20;
    } while (lVar28 < (pIVar18->Hooks).Size);
  }
  if ((pIVar18->Viewports).Size != 0) {
    uVar25 = 0;
    do {
      pIVar11 = (pIVar18->Viewports).Data[uVar25];
      ImDrawDataBuilder::Clear(&pIVar11->DrawDataBuilder);
      if (pIVar11->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar21 = GetViewportDrawList(pIVar11,0,"##Background");
        AddDrawListToDrawData((pIVar11->DrawDataBuilder).Layers,pIVar21);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != (uint)(pIVar18->Viewports).Size);
  }
  pIVar19 = GImGui;
  if (iVar9 != iVar8) {
    pIVar22 = GetTopMostAndVisiblePopupModal();
    fVar31 = pIVar19->DimBgRatio;
    if ((0.0 < fVar31) || (0.0 < pIVar19->NavWindowingHighlightAlpha)) {
      pIVar27 = pIVar19->NavWindowingTargetAnim;
      if (pIVar27 == (ImGuiWindow *)0x0) {
        cVar23 = '\0';
      }
      else {
        cVar23 = pIVar27->Active;
      }
      if ((pIVar22 != (ImGuiWindow *)0x0) || (cVar23 != '\0')) {
        if (pIVar22 == (ImGuiWindow *)0x0) {
          if (cVar23 != '\0') {
            local_48._0_4_ = (pIVar19->Style).Colors[0x33].x;
            local_48._4_4_ = (pIVar19->Style).Colors[0x33].y;
            uVar14 = (pIVar19->Style).Colors[0x33].z;
            uVar15 = (pIVar19->Style).Colors[0x33].w;
            fStack_3c = fVar31 * (pIVar19->Style).Alpha * (float)uVar15;
            local_48._8_4_ = uVar14;
            IVar20 = ColorConvertFloat4ToU32((ImVec4 *)local_48);
            RenderDimmedBackgroundBehindWindow(pIVar27,IVar20);
            pIVar22 = pIVar19->NavWindowingTargetAnim;
            pIVar11 = *(GImGui->Viewports).Data;
            fVar31 = pIVar19->FontSize;
            fVar29 = (pIVar22->Pos).x;
            fVar30 = (pIVar22->Pos).y;
            local_58.x = fVar29 - fVar31;
            local_58.y = fVar30 - fVar31;
            IStack_50.x = fVar31 + (pIVar22->Size).x + fVar29;
            IStack_50.y = fVar31 + (pIVar22->Size).y + fVar30;
            if (((pIVar11->super_ImGuiViewport).Size.x <= IStack_50.x - local_58.x) &&
               ((pIVar11->super_ImGuiViewport).Size.y <= IStack_50.y - local_58.y)) {
              fVar31 = -1.0 - fVar31;
              local_58.x = local_58.x - fVar31;
              local_58.y = local_58.y - fVar31;
              IStack_50.x = fVar31 + IStack_50.x;
              IStack_50.y = fVar31 + IStack_50.y;
            }
            if ((pIVar22->DrawList->CmdBuffer).Size == 0) {
              ImDrawList::AddDrawCmd(pIVar22->DrawList);
            }
            IVar4 = (pIVar11->super_ImGuiViewport).Pos;
            IVar5 = (pIVar11->super_ImGuiViewport).Size;
            cr_max.x = IVar5.x + IVar4.x;
            cr_max.y = IVar5.y + IVar4.y;
            ImDrawList::PushClipRect(pIVar22->DrawList,IVar4,cr_max,false);
            pIVar21 = pIVar22->DrawList;
            local_48._0_4_ = (GImGui->Style).Colors[0x32].x;
            local_48._4_4_ = (GImGui->Style).Colors[0x32].y;
            uVar16 = (GImGui->Style).Colors[0x32].z;
            uVar17 = (GImGui->Style).Colors[0x32].w;
            fStack_3c = pIVar19->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar17;
            local_48._8_4_ = uVar16;
            IVar20 = ColorConvertFloat4ToU32((ImVec4 *)local_48);
            ImDrawList::AddRect(pIVar21,&local_58,&IStack_50,IVar20,pIVar22->WindowRounding,0,3.0);
            ImDrawList::PopClipRect(pIVar22->DrawList);
          }
        }
        else {
          pIVar22 = FindBottomMostVisibleWindowWithinBeginStack(pIVar22);
          local_48._0_4_ = (pIVar19->Style).Colors[0x34].x;
          local_48._4_4_ = (pIVar19->Style).Colors[0x34].y;
          uVar12 = (pIVar19->Style).Colors[0x34].z;
          uVar13 = (pIVar19->Style).Colors[0x34].w;
          fStack_3c = fVar31 * (pIVar19->Style).Alpha * (float)uVar13;
          local_48._8_4_ = uVar12;
          IVar20 = ColorConvertFloat4ToU32((ImVec4 *)local_48);
          RenderDimmedBackgroundBehindWindow(pIVar22,IVar20);
        }
      }
    }
  }
  pIVar22 = pIVar18->NavWindowingTarget;
  if ((pIVar22 == (ImGuiWindow *)0x0) || ((pIVar22->Flags & 0x2000) != 0)) {
    pIVar27 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar27 = pIVar22->RootWindow;
  }
  local_48._0_8_ = pIVar27;
  if (pIVar22 == (ImGuiWindow *)0x0) {
    pIVar22 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar22 = pIVar18->NavWindowingListWindow;
  }
  stack0xffffffffffffffc0 = pIVar22;
  if ((pIVar18->Windows).Size != 0) {
    uVar25 = 0;
    do {
      window = (pIVar18->Windows).Data[uVar25];
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((window != pIVar22 && window != pIVar27) && (window->Flags & 0x1000000U) == 0)) {
        AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != (uint)(pIVar18->Windows).Size);
  }
  lVar26 = 0;
  do {
    pIVar22 = *(ImGuiWindow **)(local_48 + lVar26 * 8);
    if (((pIVar22 != (ImGuiWindow *)0x0) && (pIVar22->Active == true)) && (pIVar22->Hidden == false)
       ) {
      AddWindowToDrawData(pIVar22,(uint)pIVar22->Flags >> 0x19 & 1);
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 == 1);
  if ((((pIVar18->IO).MouseDrawCursor & iVar9 != iVar8) != 0) && (pIVar18->MouseCursor != -1)) {
    RenderMouseCursor((pIVar18->IO).MousePos,(pIVar18->Style).MouseCursorScale,pIVar18->MouseCursor,
                      0xffffffff,0xff000000,0x30000000);
  }
  (pIVar18->IO).MetricsRenderVertices = 0;
  (pIVar18->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar18->Viewports).Size) {
    lVar26 = 0;
    do {
      pIVar11 = (pIVar18->Viewports).Data[lVar26];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar11->DrawDataBuilder);
      if (pIVar11->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar21 = GetViewportDrawList(pIVar11,1,"##Foreground");
        AddDrawListToDrawData((pIVar11->DrawDataBuilder).Layers,pIVar21);
      }
      pIVar19 = GImGui;
      (pIVar11->DrawDataP).Valid = true;
      iVar8 = (pIVar11->DrawDataBuilder).Layers[0].Size;
      if (iVar8 < 1) {
        ppIVar24 = (ImDrawList **)0x0;
      }
      else {
        ppIVar24 = (pIVar11->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar11->DrawDataP).CmdLists = ppIVar24;
      (pIVar11->DrawDataP).CmdListsCount = iVar8;
      (pIVar11->DrawDataP).TotalIdxCount = 0;
      (pIVar11->DrawDataP).TotalVtxCount = 0;
      IVar4 = (pIVar11->super_ImGuiViewport).Size;
      (pIVar11->DrawDataP).DisplayPos = (pIVar11->super_ImGuiViewport).Pos;
      (pIVar11->DrawDataP).DisplaySize = IVar4;
      (pIVar11->DrawDataP).FramebufferScale = (pIVar19->IO).DisplayFramebufferScale;
      if (0 < iVar8) {
        lVar28 = 0;
        do {
          pIVar21 = (pIVar11->DrawDataBuilder).Layers[0].Data[lVar28];
          ImDrawList::_PopUnusedDrawCmd(pIVar21);
          piVar1 = &(pIVar11->DrawDataP).TotalVtxCount;
          *piVar1 = *piVar1 + (pIVar21->VtxBuffer).Size;
          piVar1 = &(pIVar11->DrawDataP).TotalIdxCount;
          *piVar1 = *piVar1 + (pIVar21->IdxBuffer).Size;
          lVar28 = lVar28 + 1;
        } while (lVar28 < (pIVar11->DrawDataBuilder).Layers[0].Size);
      }
      uVar2 = (pIVar11->DrawDataP).TotalIdxCount;
      uVar6 = (pIVar11->DrawDataP).TotalVtxCount;
      uVar3 = (pIVar18->IO).MetricsRenderVertices;
      uVar7 = (pIVar18->IO).MetricsRenderIndices;
      (pIVar18->IO).MetricsRenderVertices = uVar3 + uVar6;
      (pIVar18->IO).MetricsRenderIndices = uVar7 + uVar2;
      lVar26 = lVar26 + 1;
    } while (lVar26 < (pIVar18->Viewports).Size);
  }
  if (0 < (pIVar18->Hooks).Size) {
    lVar26 = 0;
    lVar28 = 0;
    do {
      pIVar10 = (pIVar18->Hooks).Data;
      if (*(int *)(pIVar10 + lVar26 + 4) == 5) {
        (**(code **)(pIVar10 + lVar26 + 0x10))(pIVar18,pIVar10 + lVar26);
      }
      lVar28 = lVar28 + 1;
      lVar26 = lVar26 + 0x20;
    } while (lVar28 < (pIVar18->Hooks).Size);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    const bool first_render_of_frame = (g.FrameCountRendered != g.FrameCount);
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Draw modal/window whitening backgrounds
    if (first_render_of_frame)
        RenderDimmedBackgrounds();

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    // Draw software mouse cursor if requested by io.MouseDrawCursor flag
    if (g.IO.MouseDrawCursor && first_render_of_frame && g.MouseCursor != ImGuiMouseCursor_None)
        RenderMouseCursor(g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = &viewport->DrawDataP;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}